

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_polygon_mesh.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::SimplePolygonMesh::readMeshFromObjFile
          (SimplePolygonMesh *this,istream *in)

{
  ulong *puVar1;
  pointer pvVar2;
  pointer pvVar3;
  bool bVar4;
  istream *piVar5;
  ulong *puVar6;
  iterator __begin3;
  pointer pvVar7;
  double v;
  pointer puStack_2c0;
  pointer local_2b8;
  Index index;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  polygonCoordInds;
  vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> coords;
  double u;
  pointer puStack_240;
  pointer local_238;
  Vector3 position;
  string token;
  Index local_1f0;
  string line;
  stringstream ss;
  
  clear(this);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  coords.super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  polygonCoordInds.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  coords.super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  coords.super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  polygonCoordInds.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  polygonCoordInds.
  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar5 = ::std::getline<char,std::char_traits<char>,std::allocator<char>>(in,(string *)&line);
    pvVar3 = polygonCoordInds.
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
    ::std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&line,_S_out|_S_in);
    token._M_dataplus._M_p = (pointer)&token.field_2;
    token._M_string_length = 0;
    token.field_2._M_local_buf[0] = '\0';
    ::std::operator>>((istream *)&ss,(string *)&token);
    bVar4 = ::std::operator==(&token,"v");
    if (bVar4) {
      operator>>((istream *)&ss,&position);
      ::std::vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_>::push_back
                ((vector<geometrycentral::Vector3,_std::allocator<geometrycentral::Vector3>_> *)
                 &this->vertexCoordinates,(value_type *)&position);
    }
    else {
      bVar4 = ::std::operator==(&token,"vt");
      if (bVar4) {
        piVar5 = ::std::istream::_M_extract<double>((double *)&ss);
        ::std::istream::_M_extract<double>((double *)piVar5);
        position.x = u;
        position.y = v;
        std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::
        emplace_back<geometrycentral::Vector2>
                  ((vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *)
                   &coords,(Vector2 *)&position);
      }
      else {
        bVar4 = ::std::operator==(&token,"vn");
        if (!bVar4) {
          bVar4 = ::std::operator==(&token,"f");
          if (bVar4) {
            local_238 = (pointer)0x0;
            local_2b8 = (pointer)0x0;
            u = 0.0;
            puStack_240 = (pointer)0x0;
            v = 0.0;
            puStack_2c0 = (pointer)0x0;
            while( true ) {
              piVar5 = ::std::operator>>((istream *)&ss,(string *)&token);
              if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
              anon_unknown_0::parseFaceIndex(&index,&token);
              if (index.position < 0) {
                ::std::getline<char,std::char_traits<char>,std::allocator<char>>(in,(string *)&line)
                ;
                ::std::__cxx11::string::find_first_not_of((char *)&line,0x2485b8);
                ::std::__cxx11::string::substr((ulong)&position,(ulong)&line);
                anon_unknown_0::parseFaceIndex(&local_1f0,(string *)&position);
                index.normal = local_1f0.normal;
                index.position = local_1f0.position;
                index.uv = local_1f0.uv;
                ::std::__cxx11::string::~string((string *)&position);
              }
              position.x = (double)index.position;
              ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&u,
                         (unsigned_long *)&position);
              if (index.uv != -1) {
                position.x = (double)index.uv;
                ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&v,
                           (unsigned_long *)&position);
              }
            }
            ::std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         *)this,(value_type *)&u);
            if ((pointer)v != puStack_2c0) {
              ::std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::push_back((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           *)&polygonCoordInds,(value_type *)&v);
            }
            ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&v);
            ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&u);
          }
        }
      }
    }
    ::std::__cxx11::string::~string((string *)&token);
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  if (polygonCoordInds.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      polygonCoordInds.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    for (pvVar7 = polygonCoordInds.
                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar7 != pvVar3; pvVar7 = pvVar7 + 1)
    {
      std::
      vector<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
      ::emplace_back<>(&this->paramCoordinates);
      puVar1 = (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      pvVar2 = (this->paramCoordinates).
               super__Vector_base<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>,_std::allocator<std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar6 = (pvVar7->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start; puVar6 != puVar1; puVar6 = puVar6 + 1)
      {
        if (*puVar6 < (ulong)((long)coords.
                                    super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)coords.
                                    super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4)) {
          std::vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::
          push_back((vector<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_> *)
                    (pvVar2 + -1),
                    coords.
                    super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
                    ._M_impl.super__Vector_impl_data._M_start + *puVar6);
        }
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&line);
  ::std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&polygonCoordInds);
  ::std::_Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>::
  ~_Vector_base(&coords.
                 super__Vector_base<geometrycentral::Vector2,_std::allocator<geometrycentral::Vector2>_>
               );
  return;
}

Assistant:

void SimplePolygonMesh::readMeshFromObjFile(std::istream& in) {
  clear();

  // corner UV coords, unpacked below
  std::vector<Vector2> coords;
  std::vector<std::vector<size_t>> polygonCoordInds;

  // parse obj format
  std::string line;
  while (getline(in, line)) {
    std::stringstream ss(line);
    std::string token;

    ss >> token;

    if (token == "v") {
      Vector3 position;
      ss >> position;

      vertexCoordinates.push_back(position);

    } else if (token == "vt") {
      double u, v;
      ss >> u >> v;

      coords.push_back(Vector2{u, v});

    } else if (token == "vn") {
      // Do nothing

    } else if (token == "f") {
      std::vector<size_t> face;
      std::vector<size_t> faceCoordInds;
      while (ss >> token) {
        Index index = parseFaceIndex(token);
        if (index.position < 0) {
          getline(in, line);
          size_t i = line.find_first_not_of("\t\n\v\f\r ");
          index = parseFaceIndex(line.substr(i));
        }

        face.push_back(index.position);

        if (index.uv != -1) {
          faceCoordInds.push_back(index.uv);
        }
      }

      polygons.push_back(face);
      if (!faceCoordInds.empty()) {
        polygonCoordInds.push_back(faceCoordInds);
      }
    }
  }

  // If we got uv coords, unpack them in to per-corner values
  if (!polygonCoordInds.empty()) {
    for (std::vector<size_t>& faceCoordInd : polygonCoordInds) {
      paramCoordinates.emplace_back();
      std::vector<Vector2>& faceCoord = paramCoordinates.back();
      for (size_t i : faceCoordInd) {
        if (i < coords.size()) faceCoord.push_back(coords[i]);
      }
    }
  }
}